

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_reader_dropcontext.c
# Opt level: O0

rfc5444_result cb_end_packet(rfc5444_reader_tlvblock_context *c,_Bool dropped)

{
  int iVar1;
  int iVar2;
  int oi;
  _Bool dropped_local;
  rfc5444_reader_tlvblock_context *c_local;
  
  iVar2 = c->consumer->order + -1;
  printf("%s: packet end (order %d): %d\n","cb_end_packet",(ulong)(uint)c->consumer->order,
         (ulong)(uint)callback_index);
  iVar1 = callback_index + 1;
  idxcb_end_packet[iVar2] = callback_index;
  callback_index = iVar1;
  return result_end_packet[iVar2];
}

Assistant:

static enum rfc5444_result
cb_end_packet(struct rfc5444_reader_tlvblock_context *c,
    bool dropped __attribute__ ((unused))) {
  int oi = c->consumer->order - 1;

#ifdef PRINT_CB
  printf("%s: packet end (order %d): %d\n", __func__, c->consumer->order, callback_index);
#endif
  idxcb_end_packet[oi] = callback_index++;
  return result_end_packet[oi];
}